

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affix.c
# Opt level: O0

int affixMain(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  err_t code_00;
  char *pcVar3;
  long in_RSI;
  int in_EDI;
  int unaff_retaddr;
  err_t code;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_EDI < 2) {
    iVar1 = affixUsage();
  }
  else {
    pcVar3 = (char *)(in_RSI + 8);
    iVar1 = in_EDI + -1;
    iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar2 == 0) {
      code_00 = affixPrepend(argc,argv);
    }
    else {
      iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar2 == 0) {
        code_00 = affixAppend(argc,argv);
      }
      else {
        iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
        ;
        if (iVar2 == 0) {
          code_00 = affixBehead(unaff_retaddr,(char **)CONCAT44(in_stack_fffffffffffffffc,iVar1));
        }
        else {
          iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
                                                ));
          if (iVar2 == 0) {
            code_00 = affixDrop(unaff_retaddr,(char **)CONCAT44(in_stack_fffffffffffffffc,iVar1));
          }
          else {
            iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                   in_stack_ffffffffffffffe8));
            if (iVar2 == 0) {
              code_00 = affixExtr(unaff_retaddr,(char **)CONCAT44(in_stack_fffffffffffffffc,iVar1));
            }
            else {
              iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                     in_stack_ffffffffffffffe8));
              if (iVar2 == 0) {
                code_00 = affixPrint(unaff_retaddr,
                                     (char **)CONCAT44(in_stack_fffffffffffffffc,iVar1));
              }
              else {
                code_00 = 0x259;
              }
            }
          }
        }
      }
    }
    if (code_00 != 0) {
      pcVar3 = errMsg(code_00);
      printf("bee2cmd/%s: %s\n","affix",pcVar3);
    }
    iVar1 = 0;
    if (code_00 != 0) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int affixMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return affixUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "prepend"))
		code = affixPrepend(argc - 1, argv + 1);
	else if (strEq(argv[0], "append"))
		code = affixAppend(argc - 1, argv + 1);
	else if (strEq(argv[0], "behead"))
		code = affixBehead(argc - 1, argv + 1);
	else if (strEq(argv[0], "drop"))
		code = affixDrop(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = affixExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = affixPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}